

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O1

Params * adios2::helper::anon_unknown_0::YAMLNodeMapToParams
                   (Params *__return_storage_ptr__,Node *node,string *hint)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  node *pnVar3;
  long *plVar4;
  InvalidNode *pIVar5;
  long *plVar6;
  size_type *psVar7;
  value vVar8;
  SeqIter SVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pair<YAML::detail::node_*,_YAML::detail::node_*> *ppVar10;
  bool bVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar12;
  const_iterator itParam;
  string value;
  string key;
  iterator_base<const_YAML::detail::iterator_value> local_218;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_1e8;
  undefined1 local_1e0 [32];
  char *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  long lStack_1a8;
  string *local_1a0;
  Node *local_198;
  string local_190;
  string local_170;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  SeqIter SStack_128;
  undefined1 local_120 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  Node local_f0;
  Node local_b0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  local_1a0 = hint;
  if (node->m_isValid == false) {
    local_218.m_iterator._0_8_ = (ulong)(uint)local_218.m_iterator._4_4_ << 0x20;
    local_218.m_iterator.m_seqIt._M_current = (node **)0x0;
    local_218.m_iterator.m_mapIt._M_current =
         (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
    local_218.m_iterator.m_mapEnd._M_current =
         (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
    local_218.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_218.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pnVar3 = node->m_pNode;
    if (pnVar3 == (node *)0x0) {
      local_218.m_iterator._0_8_ = (ulong)(uint)local_218.m_iterator._4_4_ << 0x20;
      local_218.m_iterator.m_seqIt._M_current = (node **)0x0;
      local_218.m_iterator.m_mapIt._M_current =
           (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
      local_218.m_iterator.m_mapEnd._M_current =
           (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
      local_218.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_218.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      YAML::detail::node_data::begin
                ((node_iterator *)&local_130,
                 (((pnVar3->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      local_218.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->m_pMemory).
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __return_storage_ptr__ =
           (Params *)
           (node->m_pMemory).
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_218.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_218.m_iterator.m_mapIt._M_current =
             (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_120._0_8_;
        local_218.m_iterator.m_mapEnd._M_current =
             (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_120._8_8_;
        local_218.m_iterator._0_8_ = local_130._M_p;
        local_218.m_iterator.m_seqIt._M_current = SStack_128._M_current;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
               _M_use_count + 1;
        }
        local_218.m_iterator.m_mapIt._M_current =
             (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_120._0_8_;
        local_218.m_iterator.m_mapEnd._M_current =
             (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_120._8_8_;
        local_218.m_iterator._0_8_ = local_130._M_p;
        local_218.m_iterator.m_seqIt._M_current = SStack_128._M_current;
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
               _M_use_count + 1;
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && pnVar3 != (node *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__);
    }
  }
  paVar2 = &local_b0.m_invalidKey.field_2;
  local_198 = node;
  while( true ) {
    if (node->m_isValid == true) {
      pnVar3 = node->m_pNode;
      if (pnVar3 == (node *)0x0) {
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        SVar9._M_current = (node **)0x0;
        ppVar10 = (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
        vVar8 = NoneType;
      }
      else {
        YAML::detail::node_data::end
                  ((node_iterator *)&local_130,
                   *(node_data **)
                    &((pnVar3->m_pRef).
                      super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_pData);
        this = (node->m_pMemory).
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        SVar9._M_current = SStack_128._M_current;
        ppVar10 = (pair<YAML::detail::node_*,_YAML::detail::node_*> *)local_120._0_8_;
        vVar8 = (value)local_130._M_p;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && pnVar3 != (node *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
    }
    else {
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      vVar8 = NoneType;
      ppVar10 = (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
      SVar9._M_current = (node **)0x0;
    }
    if (local_218.m_iterator.m_type == vVar8) {
      if (local_218.m_iterator.m_type == Map) {
        bVar11 = local_218.m_iterator.m_mapIt._M_current == ppVar10;
      }
      else {
        bVar11 = true;
        if (local_218.m_iterator.m_type == Sequence) {
          bVar11 = local_218.m_iterator.m_seqIt._M_current == SVar9._M_current;
        }
      }
    }
    else {
      bVar11 = false;
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (bVar11) {
      if (local_218.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      return (Params *)local_1e8;
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              ((proxy *)&local_130,&local_218);
    node = local_198;
    if (local_f0.m_isValid == false) {
      pIVar5 = (InvalidNode *)__cxa_allocate_exception(0x40);
      YAML::InvalidNode::InvalidNode(pIVar5,&local_f0.m_invalidKey);
      __cxa_throw(pIVar5,&YAML::InvalidNode::typeinfo,YAML::BadFile::~BadFile);
    }
    local_150._0_8_ = &local_f0;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()(&local_70,
               (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)local_150);
    if (local_b0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.m_invalidKey._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.m_invalidKey._M_dataplus._M_p);
    }
    if (local_f0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_invalidKey._M_dataplus._M_p != &local_f0.m_invalidKey.field_2) {
      operator_delete(local_f0.m_invalidKey._M_dataplus._M_p);
    }
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
    if (SStack_128._M_current != (node **)(local_120 + 8)) {
      operator_delete(SStack_128._M_current);
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              ((proxy *)&local_130,&local_218);
    if (local_b0.m_isValid == false) break;
    local_1e0._0_8_ = &local_b0;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()((string *)local_150,
               (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)local_1e0);
    if (local_b0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.m_invalidKey._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.m_invalidKey._M_dataplus._M_p);
    }
    if (local_f0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.m_invalidKey._M_dataplus._M_p != &local_f0.m_invalidKey.field_2) {
      operator_delete(local_f0.m_invalidKey._M_dataplus._M_p);
    }
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
    if (SStack_128._M_current != (node **)(local_120 + 8)) {
      operator_delete(SStack_128._M_current);
    }
    pVar12 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                       (local_1e8,&local_70,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_150);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_130._M_p = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Helper","");
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"adiosYAML","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"YAMLNodeMapToParams","")
      ;
      std::operator+(&local_50,"found duplicated key : ",&local_70);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_1b8._8_8_ = *plVar6;
        lStack_1a8 = plVar4[3];
        local_1c0 = local_1b8._M_local_buf + 8;
      }
      else {
        local_1b8._8_8_ = *plVar6;
        local_1c0 = (char *)*plVar4;
      }
      local_1b8._M_allocated_capacity = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c0,(ulong)(local_1a0->_M_dataplus)._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_190.field_2._M_allocated_capacity = *psVar7;
        local_190.field_2._8_8_ = plVar4[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar7;
        local_190._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_190._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      Throw<std::invalid_argument>
                ((string *)&local_130,(string *)local_1e0,&local_170,&local_190,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if (local_1c0 != local_1b8._M_local_buf + 8) {
        operator_delete(local_1c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((Node *)local_1e0._0_8_ != (Node *)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (local_130._M_p != local_120) {
        operator_delete(local_130._M_p);
      }
    }
    if ((Node *)local_150._0_8_ != (Node *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&local_218.m_iterator);
  }
  pIVar5 = (InvalidNode *)__cxa_allocate_exception(0x40);
  YAML::InvalidNode::InvalidNode(pIVar5,&local_b0.m_invalidKey);
  __cxa_throw(pIVar5,&YAML::InvalidNode::typeinfo,YAML::BadFile::~BadFile);
}

Assistant:

Params YAMLNodeMapToParams(const YAML::Node &node, const std::string &hint)
{
    Params parameters;
    for (auto itParam = node.begin(); itParam != node.end(); ++itParam)
    {
        const std::string key = itParam->first.as<std::string>();
        const std::string value = itParam->second.as<std::string>();
        auto it = parameters.emplace(key, value);
        if (!it.second)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosYAML", "YAMLNodeMapToParams",
                "found duplicated key : " + key + ", keys must be unique in a YAML node, " + hint);
        }
    }
    return parameters;
}